

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall mjs::function_base::base_print(function_base *this,wostream *os)

{
  size_type sVar1;
  pointer pbVar2;
  element_type *peVar3;
  wostream *pwVar4;
  long lVar5;
  ulong uVar6;
  
  std::operator<<(os,"{");
  sVar1 = (this->id_)._M_string_length;
  if (sVar1 != 0) {
    pwVar4 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                       (os,(this->id_)._M_dataplus._M_p,sVar1);
    std::operator<<(pwVar4,", ");
  }
  std::operator<<(os,"[");
  if ((this->params_).
      super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->params_).
      super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar5 = 8;
    uVar6 = 0;
    do {
      if (uVar6 != 0) {
        std::operator<<(os,", ");
      }
      pbVar2 = (this->params_).
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                (os,*(wchar_t **)((long)pbVar2 + lVar5 + -8),
                 *(long *)((long)&(pbVar2->_M_dataplus)._M_p + lVar5));
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x20;
    } while (uVar6 < (ulong)((long)(this->params_).
                                   super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->params_).
                                   super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  pwVar4 = std::operator<<(os,"], ");
  peVar3 = (this->block_).super___shared_ptr<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar3->super_statement).super_syntax_node._vptr_syntax_node[2])(peVar3,pwVar4);
  std::operator<<(pwVar4,"}");
  return;
}

Assistant:

void function_base::base_print(std::wostream& os) const {
    os << "{";
    if (!id_.empty()) os << id_ << ", ";
    os << "[";
    for (size_t i = 0; i < params_.size(); ++i) {
        if (i) os << ", ";
        os << params_[i];
    }
    os << "], " << *block_ << "}";
}